

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForPrimary
          (CollationBuilder *this,uint32_t p,UErrorCode *errorCode)

{
  uint uVar1;
  uint uVar2;
  int32_t *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int32_t elem;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = (this->rootPrimaryIndexes).count;
    if (uVar1 == 0) {
      uVar6 = 0xffffffff;
    }
    else {
      piVar3 = (this->rootPrimaryIndexes).elements;
      uVar5 = 0;
      uVar6 = uVar1;
      do {
        uVar7 = (ulong)uVar5;
        while( true ) {
          uVar5 = (uint)uVar7;
          uVar7 = (long)(int)(uVar5 + uVar6) / 2;
          uVar4 = (uint)uVar7;
          uVar7 = uVar7 & 0xffffffff;
          uVar2 = *(uint *)((long)(this->nodes).elements + (long)piVar3[(int)uVar4] * 8 + 4);
          if (uVar2 == p) goto LAB_002311cc;
          if (p < uVar2) break;
          if (uVar4 == uVar5) {
            uVar7 = (ulong)(-uVar5 - 2);
            goto LAB_002311cc;
          }
        }
        uVar6 = uVar4;
      } while (uVar4 != uVar5);
      uVar7 = (ulong)~uVar5;
LAB_002311cc:
      uVar6 = (uint)uVar7;
      if (-1 < (int)uVar6) {
        if ((int)uVar6 < (int)uVar1) {
          return piVar3[uVar7];
        }
        goto LAB_0023115c;
      }
    }
    elem = (this->nodes).count;
    UVector64::addElement(&this->nodes,(ulong)p << 0x20,errorCode);
    UVector32::insertElementAt(&this->rootPrimaryIndexes,elem,~uVar6,errorCode);
  }
  else {
LAB_0023115c:
    elem = 0;
  }
  return elem;
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForPrimary(uint32_t p, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    int32_t rootIndex = binarySearchForRootPrimaryNode(
        rootPrimaryIndexes.getBuffer(), rootPrimaryIndexes.size(), nodes.getBuffer(), p);
    if(rootIndex >= 0) {
        return rootPrimaryIndexes.elementAti(rootIndex);
    } else {
        // Start a new list of nodes with this primary.
        int32_t index = nodes.size();
        nodes.addElement(nodeFromWeight32(p), errorCode);
        rootPrimaryIndexes.insertElementAt(index, ~rootIndex, errorCode);
        return index;
    }
}